

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

void cali_delete_channel(cali_id_t chn_id)

{
  int iVar1;
  ostream *poVar2;
  Channel channel;
  Caliper c;
  undefined1 local_250 [48];
  undefined1 local_220 [248];
  ios_base local_128 [264];
  int local_20;
  
  cali::Caliper::Caliper((Caliper *)(local_250 + 0x10));
  cali::Caliper::get_channel((Caliper *)local_250,(cali_id_t)(local_250 + 0x10));
  if (((GlobalData *)local_250._8_8_ == (GlobalData *)0x0) ||
     (*(_Atomic_word *)(local_250._8_8_ + 8) < 1)) {
    poVar2 = (ostream *)local_220;
    std::ofstream::ofstream(poVar2);
    local_20 = 0;
    iVar1 = cali::Log::verbosity();
    if (local_20 <= iVar1) {
      poVar2 = cali::Log::get_stream((Log *)local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"cali_channel_delete(): invalid channel id ",0x2a);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_220._0_8_ = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_220 + 8));
    std::ios_base::~ios_base(local_128);
  }
  else {
    cali::Caliper::delete_channel((Caliper *)(local_250 + 0x10),(Channel *)local_250);
  }
  cali::Channel::~Channel((Channel *)local_250);
  return;
}

Assistant:

void cali_delete_channel(cali_id_t chn_id)
{
    Caliper c;
    Channel channel = c.get_channel(chn_id);

    if (channel)
        c.delete_channel(channel);
    else
        Log(0).stream() << "cali_channel_delete(): invalid channel id " << chn_id << std::endl;
}